

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
::~MatcherBase(MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
               *this)

{
  MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }